

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::ValueRangeExpression::serializeTo(ValueRangeExpression *this,ASTSerializer *serializer)

{
  Expression *pEVar1;
  ASTSerializer *in_RSI;
  ValueRangeExpression *in_RDI;
  string_view sVar2;
  char *in_stack_ffffffffffffff98;
  ASTSerializer *this_00;
  undefined8 local_50;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,in_stack_ffffffffffffff98);
  pEVar1 = left(in_RDI);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)pEVar1);
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)in_RSI);
  pEVar1 = right(in_RDI);
  ASTSerializer::write(this_00,local_30,local_28,(size_t)pEVar1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,(char *)this_00);
  sVar2 = ast::toString(Simple);
  local_50 = sVar2._M_len;
  ASTSerializer::write(in_RSI,local_40,local_38,local_50);
  return;
}

Assistant:

void ValueRangeExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());
    serializer.write("right", right());
    serializer.write("rangeKind", toString(rangeKind));
}